

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

typed_address<pstore::trailer> __thiscall
pstore::database::older_revision_footer_pos(database *this,uint revision)

{
  uint uVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  bool bVar4;
  uint tail_revision;
  undefined1 local_30 [8];
  shared_ptr<const_pstore::trailer> tail;
  uint revision_local;
  database *this_local;
  typed_address<pstore::trailer> footer_pos;
  
  tail.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = revision;
  if ((revision != 0xffffffff) && (uVar1 = get_current_revision(this), revision <= uVar1)) {
    this_local = (database *)sizes::footer_pos(&this->size_);
    do {
      getro<pstore::trailer,void>((database *)local_30,(typed_address<pstore::trailer>)this);
      peVar3 = std::
               __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base *)&(peVar3->a).generation);
      if (_Var2 < tail.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_) {
        raise<pstore::error_code>(unknown_revision);
      }
      bVar4 = _Var2 != tail.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_;
      if (bVar4) {
        peVar3 = std::
                 __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        this_local = (database *)(peVar3->a).prev_generation.a_.a_;
        trailer::validate(this,(typed_address<pstore::trailer>)this_local);
      }
      std::shared_ptr<const_pstore::trailer>::~shared_ptr
                ((shared_ptr<const_pstore::trailer> *)local_30);
    } while (bVar4);
    return (typed_address<pstore::trailer>)(address)this_local;
  }
  raise<pstore::error_code>(unknown_revision);
}

Assistant:

typed_address<trailer> database::older_revision_footer_pos (unsigned const revision) const {
        if (revision == pstore::head_revision || revision > this->get_current_revision ()) {
            raise (pstore::error_code::unknown_revision);
        }

        // Walk backwards down the linked list of revisions to find it.
        typed_address<trailer> footer_pos = size_.footer_pos ();
        for (;;) {
            auto const tail = this->getro (footer_pos);
            unsigned int const tail_revision = tail->a.generation;
            if (revision > tail_revision) {
                raise (pstore::error_code::unknown_revision);
            }
            if (tail_revision == revision) {
                break;
            }

            // TODO: check that footer_pos and generation number are getting smaller; time must
            // not be getting larger.
            footer_pos = tail->a.prev_generation;
            trailer::validate (*this, footer_pos);
        }

        return footer_pos;
    }